

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfont.cpp
# Opt level: O0

void __thiscall QFont::QFont(QFont *this,QString *family,int pointSize,int weight,bool italic)

{
  QString *family_00;
  QFontPrivate *pQVar1;
  uint in_ECX;
  int in_EDX;
  long in_RDI;
  byte in_R8B;
  long in_FS_OFFSET;
  double dVar2;
  QFontPrivate *in_stack_ffffffffffffff98;
  QList<QString> *pQVar3;
  QFontPrivate *in_stack_ffffffffffffffa0;
  uint local_38;
  int local_34;
  QList<QString> local_20;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  family_00 = (QString *)operator_new(0x98);
  QFontPrivate::QFontPrivate(in_stack_ffffffffffffffa0);
  QExplicitlySharedDataPointer<QFontPrivate>::QExplicitlySharedDataPointer
            ((QExplicitlySharedDataPointer<QFontPrivate> *)in_stack_ffffffffffffffa0,
             in_stack_ffffffffffffff98);
  *(undefined4 *)(in_RDI + 8) = 0x20000;
  if (in_EDX < 1) {
    local_34 = 0xc;
  }
  else {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 2;
    local_34 = in_EDX;
  }
  if ((int)in_ECX < 0) {
    local_38 = 400;
  }
  else {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x30;
    local_38 = in_ECX;
  }
  if ((in_R8B & 1) != 0) {
    *(uint *)(in_RDI + 8) = *(uint *)(in_RDI + 8) | 0x20;
  }
  pQVar3 = &local_20;
  splitIntoFamilies(family_00);
  QExplicitlySharedDataPointer<QFontPrivate>::operator->
            ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71153d);
  QList<QString>::operator=((QList<QString> *)in_stack_ffffffffffffffa0,pQVar3);
  QList<QString>::~QList((QList<QString> *)0x711556);
  dVar2 = (double)local_34;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x71156c);
  (pQVar1->request).pointSize = dVar2;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x711581);
  (pQVar1->request).pixelSize = -1.0;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7115a1);
  *(ulong *)&(pQVar1->request).field_0x60 =
       *(ulong *)&(pQVar1->request).field_0x60 & 0xfffc00ffffffffff |
       (ulong)(local_38 & 0x3ff) << 0x28;
  pQVar1 = QExplicitlySharedDataPointer<QFontPrivate>::operator->
                     ((QExplicitlySharedDataPointer<QFontPrivate> *)0x7115dc);
  *(ulong *)&(pQVar1->request).field_0x60 =
       *(ulong *)&(pQVar1->request).field_0x60 & 0xffffffffcfffffff |
       (ulong)((uint)(in_R8B & 1) << 0x1c);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QFont::QFont(const QString &family, int pointSize, int weight, bool italic)
    : d(new QFontPrivate()), resolve_mask(QFont::FamiliesResolved)
{
    if (pointSize <= 0) {
        pointSize = 12;
    } else {
        resolve_mask |= QFont::SizeResolved;
    }

    if (weight < 0) {
        weight = Normal;
    } else {
        resolve_mask |= QFont::WeightResolved | QFont::StyleResolved;
    }

    if (italic)
        resolve_mask |= QFont::StyleResolved;

    d->request.families = splitIntoFamilies(family);
    d->request.pointSize = qreal(pointSize);
    d->request.pixelSize = -1;
    d->request.weight = weight;
    d->request.style = italic ? QFont::StyleItalic : QFont::StyleNormal;
}